

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O3

string * __thiscall
Al::build_string<char_const(&)[37]>(string *__return_storage_ptr__,Al *this,char (*args) [37])

{
  size_t sVar1;
  ostringstream oss;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  sVar1 = strlen((char *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,(char *)this,sVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string build_string(Args&&... args) {
  std::ostringstream oss;
  (oss << ... << args);
  return oss.str();
}